

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::_next_node(Tree *this,lookup_result *r,_lookup_path_token *parent)

{
  ulong uVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  size_t sVar10;
  size_t sVar11;
  undefined8 extraout_RAX;
  long lVar12;
  char *pcVar13;
  basic_substring<const_char> *pbVar14;
  ulong uVar15;
  byte bVar16;
  csubstr cVar17;
  char msg [46];
  size_t idx;
  basic_substring<const_char> local_178;
  char local_168 [56];
  undefined2 local_130;
  undefined1 local_12e;
  _lookup_path_token local_120;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  basic_substring<const_char> local_40;
  
  bVar16 = 0;
  _next_token(&local_120,this,r,parent);
  if (local_120.type.type == NOTYPE) {
    return 0xffffffffffffffff;
  }
  sVar10 = local_120.value.len;
  switch(local_120.type.type) {
  case KEY:
    if (((local_120.value.len == 0) || (*local_120.value.str != '[')) ||
       (local_120.value.str[local_120.value.len - 1] != ']')) {
      pcVar13 = "check failed: (token.value.begins_with(\'[\') && token.value.ends_with(\']\'))";
      pbVar14 = &local_178;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        pbVar14->str = *(char **)pcVar13;
        pcVar13 = pcVar13 + ((ulong)bVar16 * -2 + 1) * 8;
        pbVar14 = (basic_substring<const_char> *)&pbVar14[-(ulong)bVar16].len;
      }
      local_12e = 0;
      local_130 = 0x2929;
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar2 = (code *)swi(3);
        sVar10 = (*pcVar2)();
        return sVar10;
      }
      local_e0 = 0;
      uStack_d8 = 0x6920;
      local_d0 = 0;
      pcStack_c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c0 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x6920) << 0x40);
      LVar7.name.str._0_4_ = 0x214288;
      LVar7.super_LineCol.offset = auVar4._0_8_;
      LVar7.super_LineCol.line = auVar4._8_8_;
      LVar7.super_LineCol.col = auVar4._16_8_;
      LVar7.name.str._4_4_ = 0;
      LVar7.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x4b,LVar7,(this->m_callbacks).m_user_data);
      if (sVar10 == 0) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar2 = (code *)swi(3);
          sVar10 = (*pcVar2)();
          return sVar10;
        }
        handle_error(0x214335,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1560,"left >= 0 && left <= len");
      }
    }
    basic_substring<const_char>::basic_substring(&local_178,local_120.value.str + 1,sVar10 - 2);
    local_40.str = local_178.str;
    local_40.len = local_178.len;
    local_178 = basic_substring<const_char>::triml(&local_40,' ');
    local_120.value = basic_substring<const_char>::trimr(&local_178,' ');
    local_40.str = (char *)0x0;
    cVar17.len = (size_t)&local_40;
    cVar17.str = (char *)local_120.value.len;
    bVar9 = atou<unsigned_long>((c4 *)local_120.value.str,cVar17,(unsigned_long *)&local_40);
    if (!bVar9) {
      builtin_strncpy(local_168,"om_chars(token.value, &idx)",0x1c);
      local_178.len._0_1_ = 'i';
      local_178.len._1_1_ = 'l';
      local_178.len._2_1_ = 'e';
      local_178.len._3_1_ = 'd';
      local_178.len._4_1_ = ':';
      local_178.len._5_1_ = ' ';
      local_178.len._6_1_ = 'f';
      local_178.len._7_1_ = 'r';
      local_178.str = (char *)0x6166206b63656863;
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar2 = (code *)swi(3);
        sVar10 = (*pcVar2)();
        return sVar10;
      }
      local_108 = 0;
      uStack_100 = 0x6923;
      local_f8 = 0;
      pcStack_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_e8 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x6923) << 0x40);
      LVar8.name.str._0_4_ = 0x214288;
      LVar8.super_LineCol.offset = auVar4._0_8_;
      LVar8.super_LineCol.line = auVar4._8_8_;
      LVar8.super_LineCol.col = auVar4._16_8_;
      LVar8.name.str._4_4_ = 0;
      LVar8.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x2c,LVar8,(this->m_callbacks).m_user_data);
    }
    sVar11 = child(this,r->closest,(size_t)local_40.str);
    goto LAB_001d1d46;
  case KEYVAL:
    cVar17 = lookup_result::unresolved(r);
    if (cVar17.str != (char *)0x0 && cVar17.len != 0) {
      builtin_strncpy(local_168,"->unresolved().empty())",0x18);
      local_178.len._0_1_ = 'i';
      local_178.len._1_1_ = 'l';
      local_178.len._2_1_ = 'e';
      local_178.len._3_1_ = 'd';
      local_178.len._4_1_ = ':';
      local_178.len._5_1_ = ' ';
      local_178.len._6_1_ = '(';
      local_178.len._7_1_ = 'r';
      local_178.str = (char *)0x6166206b63656863;
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar2 = (code *)swi(3);
        sVar10 = (*pcVar2)();
        return sVar10;
      }
      local_b8 = 0;
      uStack_b0 = 0x691a;
      local_a8 = 0;
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x691a) << 0x40);
      LVar6.name.str._0_4_ = 0x214288;
      LVar6.super_LineCol.offset = auVar4._0_8_;
      LVar6.super_LineCol.line = auVar4._8_8_;
      LVar6.super_LineCol.col = auVar4._16_8_;
      LVar6.name.str._4_4_ = 0;
      LVar6.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x28,LVar6,(this->m_callbacks).m_user_data);
    }
    uVar15 = r->closest;
    if ((uVar15 == 0xffffffffffffffff) || (this->m_cap <= uVar15)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar2 = (code *)swi(3);
        sVar10 = (*pcVar2)();
        return sVar10;
      }
      local_178 = (basic_substring<const_char>)(ZEXT816(0x4b86) << 0x40);
      local_168[0] = '\0';
      local_168[1] = '\0';
      local_168[2] = '\0';
      local_168[3] = '\0';
      local_168[4] = '\0';
      local_168[5] = '\0';
      local_168[6] = '\0';
      local_168[7] = '\0';
      local_168[8] = -0x78;
      local_168[9] = 'B';
      local_168[10] = '!';
      local_168[0xb] = '\0';
      local_168[0xc] = '\0';
      local_168[0xd] = '\0';
      local_168[0xe] = 0;
      local_168[0xf] = '\0';
      local_168[0x10] = 'e';
      local_168[0x11] = '\0';
      local_168[0x12] = '\0';
      local_168[0x13] = 0;
      local_168[0x14] = '\0';
      local_168[0x15] = '\0';
      local_168[0x16] = '\0';
      local_168[0x17] = '\0';
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[uVar15].m_type.type & MAP) == NOTYPE) goto LAB_001d1d66;
    break;
  case MAP:
  case SEQ:
    if ((local_120.value.len != 0) && (*local_120.value.str == '[')) {
      builtin_strncpy(local_168,"token.value.begins_with(\'[\'))",0x1e);
      local_178.len._0_1_ = 'i';
      local_178.len._1_1_ = 'l';
      local_178.len._2_1_ = 'e';
      local_178.len._3_1_ = 'd';
      local_178.len._4_1_ = ':';
      local_178.len._5_1_ = ' ';
      local_178.len._6_1_ = '(';
      local_178.len._7_1_ = '!';
      local_178.str = (char *)0x6166206b63656863;
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar2 = (code *)swi(3);
        sVar10 = (*pcVar2)();
        return sVar10;
      }
      local_68 = 0;
      uStack_60 = 0x6913;
      local_58 = 0;
      pcStack_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_48 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x6913) << 0x40);
      LVar3.name.str._0_4_ = 0x214288;
      LVar3.super_LineCol.offset = auVar4._0_8_;
      LVar3.super_LineCol.line = auVar4._8_8_;
      LVar3.super_LineCol.col = auVar4._16_8_;
      LVar3.name.str._4_4_ = 0;
      LVar3.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x2e,LVar3,(this->m_callbacks).m_user_data);
    }
    uVar15 = r->closest;
    if ((uVar15 == 0xffffffffffffffff) || (this->m_cap <= uVar15)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar2 = (code *)swi(3);
        sVar10 = (*pcVar2)();
        return sVar10;
      }
      local_178 = (basic_substring<const_char>)(ZEXT816(0x4b86) << 0x40);
      local_168[0] = '\0';
      local_168[1] = '\0';
      local_168[2] = '\0';
      local_168[3] = '\0';
      local_168[4] = '\0';
      local_168[5] = '\0';
      local_168[6] = '\0';
      local_168[7] = '\0';
      local_168[8] = -0x78;
      local_168[9] = 'B';
      local_168[10] = '!';
      local_168[0xb] = '\0';
      local_168[0xc] = '\0';
      local_168[0xd] = '\0';
      local_168[0xe] = 0;
      local_168[0xf] = '\0';
      local_168[0x10] = 'e';
      local_168[0x11] = '\0';
      local_168[0x12] = '\0';
      local_168[0x13] = 0;
      local_168[0x14] = '\0';
      local_168[0x15] = '\0';
      local_168[0x16] = '\0';
      local_168[0x17] = '\0';
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[uVar15].m_type.type & MAP) == NOTYPE) {
      builtin_strncpy(local_168,"s_map(r->closest))",0x13);
      local_178.len._0_1_ = 'i';
      local_178.len._1_1_ = 'l';
      local_178.len._2_1_ = 'e';
      local_178.len._3_1_ = 'd';
      local_178.len._4_1_ = ':';
      local_178.len._5_1_ = ' ';
      local_178.len._6_1_ = '(';
      local_178.len._7_1_ = 'i';
      local_178.str = (char *)0x6166206b63656863;
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar2 = (code *)swi(3);
        sVar10 = (*pcVar2)();
        return sVar10;
      }
      local_90 = 0;
      uStack_88 = 0x6915;
      local_80 = 0;
      pcStack_78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_70 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x6915) << 0x40);
      LVar5.name.str._0_4_ = 0x214288;
      LVar5.super_LineCol.offset = auVar4._0_8_;
      LVar5.super_LineCol.line = auVar4._8_8_;
      LVar5.super_LineCol.col = auVar4._16_8_;
      LVar5.name.str._4_4_ = 0;
      LVar5.name.len = 0x65;
      (*(this->m_callbacks).m_error)((char *)&local_178,0x23,LVar5,(this->m_callbacks).m_user_data);
    }
    break;
  default:
    _next_node();
    __clang_call_terminate(extraout_RAX);
  }
  sVar11 = find_child(this,r->closest,&local_120.value);
LAB_001d1d46:
  if (sVar11 != 0xffffffffffffffff) {
    (parent->type).type = local_120.type.type;
    (parent->value).str = local_120.value.str;
    (parent->value).len = local_120.value.len;
    return sVar11;
  }
LAB_001d1d66:
  uVar15 = 0;
  if (r->path_pos != 0) {
    uVar15 = r->path_pos - 1;
  }
  uVar1 = (r->path).len;
  if (uVar15 <= uVar1) {
    basic_substring<const_char>::basic_substring(&local_178,(r->path).str + uVar15,uVar1 - uVar15);
    sVar10 = r->path_pos - sVar10;
    r->path_pos = sVar10;
    if ((local_178.len != 0) && (*local_178.str == '.')) {
      r->path_pos = sVar10 - 1;
    }
    return 0xffffffffffffffff;
  }
  if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
    pcVar2 = (code *)swi(3);
    sVar10 = (*pcVar2)();
    return sVar10;
  }
  handle_error(0x214335,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

size_t Tree::_next_node(lookup_result * r, _lookup_path_token *parent) const
{
    _lookup_path_token token = _next_token(r, *parent);
    if( ! token)
        return NONE;

    size_t node = NONE;
    csubstr prev = token.value;
    if(token.type == MAP || token.type == SEQ)
    {
        _RYML_CB_ASSERT(m_callbacks, !token.value.begins_with('['));
        //_RYML_CB_ASSERT(m_callbacks, is_container(r->closest) || r->closest == NONE);
        _RYML_CB_ASSERT(m_callbacks, is_map(r->closest));
        node = find_child(r->closest, token.value);
    }
    else if(token.type == KEYVAL)
    {
        _RYML_CB_ASSERT(m_callbacks, r->unresolved().empty());
        if(is_map(r->closest))
            node = find_child(r->closest, token.value);
    }
    else if(token.type == KEY)
    {
        _RYML_CB_ASSERT(m_callbacks, token.value.begins_with('[') && token.value.ends_with(']'));
        token.value = token.value.offs(1, 1).trim(' ');
        size_t idx = 0;
        _RYML_CB_CHECK(m_callbacks, from_chars(token.value, &idx));
        node = child(r->closest, idx);
    }
    else
    {
        C4_NEVER_REACH();
    }

    if(node != NONE)
    {
        *parent = token;
    }
    else
    {
        csubstr p = r->path.sub(r->path_pos > 0 ? r->path_pos - 1 : r->path_pos);
        r->path_pos -= prev.len;
        if(p.begins_with('.'))
            r->path_pos -= 1u;
    }

    return node;
}